

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O3

int req0_sock_get_resend_tick(void *arg,void *buf,size_t *szp,nni_opt_type t)

{
  nng_duration d;
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x358));
  d = *(nng_duration *)((long)arg + 0x350);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x358));
  iVar1 = nni_copyout_ms(d,buf,szp,t);
  return iVar1;
}

Assistant:

static int
req0_sock_get_resend_tick(void *arg, void *buf, size_t *szp, nni_opt_type t)
{
	req0_sock   *s = arg;
	nng_duration tick;

	nni_mtx_lock(&s->mtx);
	tick = s->retry_tick;
	nni_mtx_unlock(&s->mtx);
	return (nni_copyout_ms(tick, buf, szp, t));
}